

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O1

void OnUpdateGamefield(Gamefield *gamefield)

{
  ulong uVar1;
  uint8_t *__ptr;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  gamefield->simulationStep = gamefield->simulationStep + '\x01';
  if (gamefield->height != 0) {
    lVar5 = 0;
    lVar4 = 0;
    uVar2 = 0;
    do {
      uVar1 = (ulong)gamefield->width;
      if (uVar1 != 0) {
        lVar6 = 8;
        uVar3 = 0;
        do {
          if ((&(gamefield->pixels->color).r)[lVar6 + uVar1 * lVar5] != gamefield->simulationStep) {
            switch(*(undefined4 *)((long)gamefield->pixels + lVar6 + -4 + uVar1 * lVar5)) {
            case 0:
              SandStep(gamefield,(IntVec2)(lVar4 + uVar3));
              break;
            case 1:
              WaterStep(gamefield,(IntVec2)(lVar4 + uVar3));
              break;
            case 5:
              SmokeStep(gamefield,(IntVec2)(lVar4 + uVar3));
              break;
            case 6:
              FireStep(gamefield,(IntVec2)(lVar4 + uVar3));
            }
          }
          uVar3 = uVar3 + 1;
          uVar1 = (ulong)gamefield->width;
          lVar6 = lVar6 + 0x14;
        } while (uVar3 < uVar1);
      }
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 0x100000000;
      lVar5 = lVar5 + 0x14;
    } while (uVar2 < gamefield->height);
  }
  __ptr = GetRawColor32Array(gamefield);
  (*glad_glTexImage2D)(0xde1,0,0x1908,gamefield->width,gamefield->height,0,0x1908,0x1401,__ptr);
  free(__ptr);
  return;
}

Assistant:

void OnUpdateGamefield(Gamefield* gamefield) {
    gamefield->simulationStep += 1;
    for (size_t y = 0; y < gamefield->height; y++) {
        for (size_t x = 0; x < gamefield->width; x++) {
            if (gamefield->pixels[y * gamefield->width + x].lastUpdatedFrameNumber == gamefield->simulationStep) continue;
            IntVec2 coords;
            coords.x = x;
            coords.y = y;
            if (gamefield->pixels[y * gamefield->width + x].pixelType == Sand) {
                SandStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Water) {
                WaterStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Smoke) {
                SmokeStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Fire) {
                FireStep(gamefield, coords);
            }
        }
    }

    uint8_t* rawPixelArray = NULL;
    if (rawPixelArray == NULL) {
        rawPixelArray = GetRawColor32Array(gamefield);
    }
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, gamefield->width, gamefield->height, 0, GL_RGBA, GL_UNSIGNED_BYTE, rawPixelArray);
    free(rawPixelArray);
}